

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_cheat.cpp
# Opt level: O0

void __thiscall DSuicider::Tick(DSuicider *this)

{
  double dVar1;
  APlayerPawn *pAVar2;
  APlayerPawn *inflictor;
  APlayerPawn *source;
  Self local_34;
  TAngle<double> local_30;
  FName local_24;
  double local_20;
  double plyrdmgfact;
  DSuicider *local_10;
  DSuicider *this_local;
  
  local_10 = this;
  pAVar2 = TObjPtr<APlayerPawn>::operator->(&this->Pawn);
  TFlags<ActorFlag,_unsigned_int>::operator|=(&(pAVar2->super_AActor).flags,MF_SHOOTABLE);
  operator~((int)&plyrdmgfact + MF2_DONTSEEKINVISIBLE);
  pAVar2 = TObjPtr<APlayerPawn>::operator->(&this->Pawn);
  TFlags<ActorFlag2,_unsigned_int>::operator&=
            (&(pAVar2->super_AActor).flags2,(Self *)((long)&plyrdmgfact + 4));
  pAVar2 = TObjPtr<APlayerPawn>::operator->(&this->Pawn);
  local_20 = (pAVar2->super_AActor).DamageFactor;
  pAVar2 = TObjPtr<APlayerPawn>::operator->(&this->Pawn);
  (pAVar2->super_AActor).DamageFactor = 1.0;
  pAVar2 = ::TObjPtr::operator_cast_to_APlayerPawn_((TObjPtr *)&this->Pawn);
  inflictor = ::TObjPtr::operator_cast_to_APlayerPawn_((TObjPtr *)&this->Pawn);
  source = ::TObjPtr::operator_cast_to_APlayerPawn_((TObjPtr *)&this->Pawn);
  FName::FName(&local_24,NAME_Suicide);
  TAngle<double>::TAngle(&local_30,0.0);
  P_DamageMobj(&pAVar2->super_AActor,&inflictor->super_AActor,&source->super_AActor,1000000,
               &local_24,0,&local_30);
  dVar1 = local_20;
  pAVar2 = TObjPtr<APlayerPawn>::operator->(&this->Pawn);
  (pAVar2->super_AActor).DamageFactor = dVar1;
  pAVar2 = TObjPtr<APlayerPawn>::operator->(&this->Pawn);
  if ((pAVar2->super_AActor).health < 1) {
    operator~((EnumType)&local_34);
    pAVar2 = TObjPtr<APlayerPawn>::operator->(&this->Pawn);
    TFlags<ActorFlag,_unsigned_int>::operator&=(&(pAVar2->super_AActor).flags,&local_34);
  }
  (*(this->super_DThinker).super_DObject._vptr_DObject[4])();
  return;
}

Assistant:

void Tick()
	{
		Pawn->flags |= MF_SHOOTABLE;
		Pawn->flags2 &= ~MF2_INVULNERABLE;
		// Store the player's current damage factor, to restore it later.
		double plyrdmgfact = Pawn->DamageFactor;
		Pawn->DamageFactor = 1.;
		P_DamageMobj (Pawn, Pawn, Pawn, TELEFRAG_DAMAGE, NAME_Suicide);
		Pawn->DamageFactor = plyrdmgfact;
		if (Pawn->health <= 0)
		{
			Pawn->flags &= ~MF_SHOOTABLE;
		}
		Destroy();
	}